

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessagesTestCase.cpp
# Opt level: O1

void __thiscall SuiteMessageTests::TestrejectSetString::RunImpl(TestrejectSetString *this)

{
  TestResults *pTVar1;
  TestResults **ppTVar2;
  FieldBase *pFVar3;
  TestDetails **ppTVar4;
  RefSeqNum refSeqNum;
  Text text;
  Reject object;
  int local_24c;
  TestDetails local_248;
  FieldBase local_228;
  FieldBase local_1c8;
  Reject local_168;
  
  FIX42::Reject::Reject(&local_168);
  local_228._vptr_FieldBase = (_func_int **)&local_228.m_string;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_228,
             "8=FIX.4.2\x019=36\x0135=3\x0145=73\x0158=This Message SUCKS!!!\x0110=029\x01","");
  FIX::Message::setString
            ((string *)&local_168,SUB81(&local_228,0),(DataDictionary *)0x1,(DataDictionary *)0x0);
  if ((string *)local_228._vptr_FieldBase != &local_228.m_string) {
    operator_delete(local_228._vptr_FieldBase,(ulong)(local_228.m_string._M_dataplus._M_p + 1));
  }
  FIX::IntField::IntField((IntField *)&local_228,0x2d);
  local_228._vptr_FieldBase = (_func_int **)&PTR__FieldBase_00326d88;
  FIX::StringField::StringField((StringField *)&local_1c8,0x3a);
  local_1c8._vptr_FieldBase = (_func_int **)&PTR__FieldBase_003265b0;
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  local_24c = 0x49;
  pFVar3 = FIX::FieldMap::getField((FieldMap *)&local_168,&local_228);
  ppTVar4 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_248,*ppTVar4,0x2d9);
  UnitTest::CheckEqual<int,FIX::RefSeqNum>(pTVar1,&local_24c,(RefSeqNum *)pFVar3,&local_248);
  ppTVar2 = UnitTest::CurrentTest::Results();
  pTVar1 = *ppTVar2;
  pFVar3 = FIX::FieldMap::getField((FieldMap *)&local_168,&local_1c8);
  ppTVar4 = UnitTest::CurrentTest::Details();
  UnitTest::TestDetails::TestDetails(&local_248,*ppTVar4,0x2da);
  UnitTest::CheckEqual<char[22],FIX::Text>
            (pTVar1,(char (*) [22])"This Message SUCKS!!!",(Text *)pFVar3,&local_248);
  FIX::FieldBase::~FieldBase(&local_1c8);
  FIX::FieldBase::~FieldBase(&local_228);
  FIX::Message::~Message((Message *)&local_168);
  return;
}

Assistant:

TEST(rejectSetString)
{
  Reject object;

  object.setString
    ( "8=FIX.4.2\0019=36\00135=3\00145=73\001"
      "58=This Message SUCKS!!!\00110=029\001" );

  RefSeqNum refSeqNum;
  Text text;
  CHECK_EQUAL( 73, object.get( refSeqNum ) );
  CHECK_EQUAL( "This Message SUCKS!!!", object.get( text ) );
}